

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

_Bool sbs_check_type(sbs_t *sbs,uint8_t type)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (sbs->roaring->high_low_container).size;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  bVar4 = true;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (bVar4) {
      bVar4 = (sbs->roaring->high_low_container).typecodes[uVar3] == type;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool sbs_check_type(sbs_t *sbs, uint8_t type) {
    bool answer = true;
    for (int32_t i = 0; i < sbs->roaring->high_low_container.size; i++) {
        answer =
            answer && (sbs->roaring->high_low_container.typecodes[i] == type);
    }
    return answer;
}